

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mailbox_safe.cpp
# Opt level: O3

ssize_t __thiscall
zmq::mailbox_safe_t::send(mailbox_safe_t *this,int __fd,void *__buf,size_t __n,int __flags)

{
  atomic_ptr_t<zmq::command_t> *paVar1;
  command_t *pcVar2;
  pointer ppsVar3;
  int iVar4;
  command_t *pcVar5;
  undefined4 extraout_var;
  ssize_t sVar6;
  int __flags_00;
  command_t *__n_00;
  size_t __n_01;
  void *extraout_RDX;
  void *pvVar7;
  void *extraout_RDX_00;
  size_t __n_02;
  undefined4 in_register_00000034;
  void *__buf_00;
  pointer ppsVar8;
  bool bVar9;
  
  __buf_00 = (void *)CONCAT44(in_register_00000034,__fd);
  pvVar7 = __buf_00;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)this->_sync);
  if (iVar4 != 0) {
    send(iVar4,pvVar7,__n_01,(int)__n);
  }
  ypipe_t<zmq::command_t,_16>::write(&this->_cpipe,__fd,(void *)0x0,__n);
  __n_00 = (this->_cpipe)._w;
  pcVar2 = (this->_cpipe)._f;
  if (__n_00 != pcVar2) {
    paVar1 = &(this->_cpipe)._c;
    LOCK();
    pcVar5 = (paVar1->_ptr)._M_b._M_p;
    bVar9 = __n_00 == pcVar5;
    if (bVar9) {
      (paVar1->_ptr)._M_b._M_p = pcVar2;
      pcVar5 = __n_00;
    }
    UNLOCK();
    if (bVar9) {
      pcVar5 = __n_00;
    }
    __n_00 = (this->_cpipe)._f;
    if (pcVar5 == (this->_cpipe)._w) {
      (this->_cpipe)._w = __n_00;
    }
    else {
      LOCK();
      (this->_cpipe)._c._ptr._M_b._M_p = __n_00;
      UNLOCK();
      (this->_cpipe)._w = __n_00;
      std::_V2::condition_variable_any::notify_all(&(this->_cond_var)._cv);
      ppsVar3 = (this->_signalers).
                super__Vector_base<zmq::signaler_t_*,_std::allocator<zmq::signaler_t_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      pvVar7 = extraout_RDX;
      for (ppsVar8 = (this->_signalers).
                     super__Vector_base<zmq::signaler_t_*,_std::allocator<zmq::signaler_t_*>_>.
                     _M_impl.super__Vector_impl_data._M_start; ppsVar8 != ppsVar3;
          ppsVar8 = ppsVar8 + 1) {
        signaler_t::send(*ppsVar8,(int)__buf_00,pvVar7,(size_t)__n_00,__flags);
        pvVar7 = extraout_RDX_00;
      }
    }
  }
  __flags_00 = (int)__n_00;
  iVar4 = pthread_mutex_unlock((pthread_mutex_t *)this->_sync);
  sVar6 = CONCAT44(extraout_var,iVar4);
  if (iVar4 != 0) {
    sVar6 = send(iVar4,__buf_00,__n_02,__flags_00);
  }
  return sVar6;
}

Assistant:

void zmq::mailbox_safe_t::send (const command_t &cmd_)
{
    _sync->lock ();
    _cpipe.write (cmd_, false);
    const bool ok = _cpipe.flush ();

    if (!ok) {
        _cond_var.broadcast ();

        for (std::vector<signaler_t *>::iterator it = _signalers.begin (),
                                                 end = _signalers.end ();
             it != end; ++it) {
            (*it)->send ();
        }
    }

    _sync->unlock ();
}